

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

int find_param(VARR_token_t *params,char *name)

{
  char cVar1;
  size_t sVar2;
  token_t *pptVar3;
  VARR_char *pVVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  FILE *__stream;
  undefined8 in_RCX;
  char *str;
  char *pcVar11;
  c2m_ctx_t c2m_ctx;
  size_t sVar12;
  
  iVar6 = (int)in_RCX;
  if (params == (VARR_token_t *)0x0) {
    find_param_cold_3();
    pcVar11 = name;
    c2m_ctx = (c2m_ctx_t)params;
LAB_00195fe0:
    find_param_cold_2();
  }
  else {
    sVar2 = params->els_num;
    pcVar11 = "__VA_ARGS__";
    c2m_ctx = (c2m_ctx_t)name;
    iVar5 = strcmp(name,"__VA_ARGS__");
    iVar6 = (int)CONCAT71((int7)((ulong)in_RCX >> 8),sVar2 != 0 && iVar5 == 0);
    if (sVar2 != 0 && iVar5 == 0) {
      if (params->varr == (token_t *)0x0) goto LAB_00195fe0;
      if (*(short *)params->varr[sVar2 - 1] == 0x10f) {
        return (int)sVar2 + -1;
      }
    }
    if (sVar2 == 0) {
      return -1;
    }
    pptVar3 = params->varr;
    if (pptVar3 != (token_t *)0x0) {
      sVar12 = 0;
      do {
        iVar6 = strcmp(pptVar3[sVar12]->repr,name);
        if (iVar6 == 0) {
          return (int)sVar12;
        }
        sVar12 = sVar12 + 1;
      } while (sVar2 != sVar12);
      return -1;
    }
  }
  find_param_cold_1();
  pVVar4 = c2m_ctx->temp_string;
  if ((pVVar4 == (VARR_char *)0x0) || (pVVar4->varr == (char *)0x0)) {
LAB_001961a6:
    get_full_name_cold_4();
  }
  else {
    pVVar4->els_num = 0;
    if (*pcVar11 == '\0') {
      if ((str == (char *)0x0) || (pcVar11 = str, *str == '\0')) {
        __assert_fail("name != NULL && name[0] != \'\\0\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x97c,"const char *get_full_name(c2m_ctx_t, const char *, const char *, int)"
                     );
      }
      goto LAB_0019618f;
    }
    if (iVar6 == 0) {
      pcVar8 = strrchr(pcVar11,0x2f);
      if (pcVar8 == (char *)0x0) {
        add_to_temp_string(c2m_ctx,".");
LAB_00196165:
        add_to_temp_string(c2m_ctx,"/");
      }
      else {
        for (; pcVar11 <= pcVar8; pcVar11 = pcVar11 + 1) {
          pVVar4 = c2m_ctx->temp_string;
          if (pVVar4->varr == (char *)0x0) {
            get_full_name_cold_1();
            goto LAB_001961a6;
          }
          cVar1 = *pcVar11;
          uVar9 = pVVar4->els_num + 1;
          if (pVVar4->size < uVar9) {
            sVar7 = (uVar9 >> 1) + uVar9;
            pcVar10 = (char *)realloc(pVVar4->varr,sVar7);
            pVVar4->varr = pcVar10;
            pVVar4->size = sVar7;
          }
          sVar2 = pVVar4->els_num;
          pVVar4->els_num = sVar2 + 1;
          pVVar4->varr[sVar2] = cVar1;
        }
        pVVar4 = c2m_ctx->temp_string;
        pcVar11 = pVVar4->varr;
        if (pcVar11 == (char *)0x0) {
          get_full_name_cold_2();
          __stream = fopen(pcVar11,"r");
          if (__stream != (FILE *)0x0) {
            fclose(__stream);
          }
          return (uint)(__stream != (FILE *)0x0);
        }
        uVar9 = pVVar4->els_num + 1;
        if (pVVar4->size < uVar9) {
          sVar7 = (uVar9 >> 1) + uVar9;
          pcVar11 = (char *)realloc(pcVar11,sVar7);
          pVVar4->varr = pcVar11;
          pVVar4->size = sVar7;
        }
        sVar2 = pVVar4->els_num;
        pVVar4->els_num = sVar2 + 1;
        pVVar4->varr[sVar2] = '\0';
      }
    }
    else {
      sVar7 = strlen(pcVar11);
      if (sVar7 == 0) goto LAB_001961b0;
      add_to_temp_string(c2m_ctx,pcVar11);
      if (pcVar11[sVar7 - 1] != '/') goto LAB_00196165;
    }
    add_to_temp_string(c2m_ctx,str);
    if (c2m_ctx->temp_string != (VARR_char *)0x0) {
      pcVar11 = c2m_ctx->temp_string->varr;
LAB_0019618f:
      return (int)pcVar11;
    }
  }
  get_full_name_cold_3();
LAB_001961b0:
  __assert_fail("len > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x984,"const char *get_full_name(c2m_ctx_t, const char *, const char *, int)");
}

Assistant:

static int find_param (VARR (token_t) * params, const char *name) {
  size_t len = VARR_LENGTH (token_t, params);
  token_t param;

  if (strcmp (name, varg) == 0 && len != 0 && VARR_LAST (token_t, params)->code == T_DOTS)
    return (int) len - 1;
  for (size_t i = 0; i < len; i++) {
    param = VARR_GET (token_t, params, i);
    if (strcmp (param->repr, name) == 0) return (int) i;
  }
  return -1;
}